

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqGrNode.cc
# Opt level: O0

void * EqGrNode::bsearch(void *__key,void *__base,size_t __nmemb,size_t __size,
                        __compar_fn_t __compar)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  element_type *this;
  __shared_ptr_access<FreqIt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  void *pvVar4;
  shared_ptr<FreqIt> local_98;
  shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
  local_88;
  shared_ptr<FreqIt> local_78;
  shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
  local_68 [2];
  shared_ptr<FreqIt> local_48;
  int local_34;
  int local_30;
  int res;
  int mid;
  int recursive_local;
  FreqIt_S *fit_local;
  FreqIt_SS *freqArray_local;
  uint local_10;
  int max_local;
  int min_local;
  
  local_10 = (uint)__key;
  freqArray_local._4_4_ = (uint)__base;
  res = (int)__compar;
  local_30 = (int)(freqArray_local._4_4_ + local_10) / 2;
  if ((int)freqArray_local._4_4_ < (int)local_10) {
    max_local = -1;
  }
  else {
    _mid = __size;
    fit_local = (FreqIt_S *)__nmemb;
    this = std::
           __shared_ptr_access<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)__nmemb);
    this_00 = (__shared_ptr_access<FreqIt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>::at
                        (this,(long)local_30);
    this_01 = std::__shared_ptr_access<FreqIt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        (this_00);
    std::shared_ptr<FreqIt>::shared_ptr(&local_48,(shared_ptr<FreqIt> *)__size);
    iVar1 = FreqIt::compare(this_01,&local_48,res);
    std::shared_ptr<FreqIt>::~shared_ptr(&local_48);
    uVar3 = local_10;
    uVar2 = freqArray_local._4_4_;
    if (iVar1 == 0) {
      max_local = local_30;
    }
    else {
      local_34 = iVar1;
      if (iVar1 < 0) {
        uVar2 = local_30 - 1;
        std::
        shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
        ::shared_ptr(local_68,(shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
                               *)__nmemb);
        std::shared_ptr<FreqIt>::shared_ptr(&local_78,(shared_ptr<FreqIt> *)__size);
        pvVar4 = bsearch((void *)(ulong)uVar3,(void *)(ulong)uVar2,(size_t)local_68,
                         (size_t)&local_78,(__compar_fn_t)(ulong)(uint)res);
        max_local = (int)pvVar4;
        std::shared_ptr<FreqIt>::~shared_ptr(&local_78);
        std::
        shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
        ::~shared_ptr(local_68);
      }
      else {
        uVar3 = local_30 + 1;
        std::
        shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
        ::shared_ptr(&local_88,
                     (shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
                      *)__nmemb);
        std::shared_ptr<FreqIt>::shared_ptr(&local_98,(shared_ptr<FreqIt> *)__size);
        pvVar4 = bsearch((void *)(ulong)uVar3,(void *)(ulong)uVar2,(size_t)&local_88,
                         (size_t)&local_98,(__compar_fn_t)(ulong)(uint)res);
        max_local = (int)pvVar4;
        std::shared_ptr<FreqIt>::~shared_ptr(&local_98);
        std::
        shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
        ::~shared_ptr(&local_88);
      }
    }
  }
  return (void *)(ulong)(uint)max_local;
}

Assistant:

int EqGrNode::bsearch(int min, int max, FreqIt_SS freqArray, FreqIt_S fit, int recursive) {
    int mid = (max + min) / 2;
    if (max < min) return -1;

    int res = freqArray->at(mid)->compare(fit, recursive);
    if (res == 0) return mid;
    else if (res < 0) return bsearch(min, mid - 1, freqArray, fit, recursive);
    else return bsearch(mid + 1, max, freqArray, fit, recursive);
}